

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_tests.cpp
# Opt level: O3

void __thiscall skiwi::anon_unknown_0::cleanup(anon_unknown_0 *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  undefined1 *puVar5;
  ulong uVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  long lVar9;
  string line;
  istringstream s;
  undefined1 *local_1d8;
  ulong local_1d0;
  undefined1 local_1c8;
  undefined7 uStack_1c7;
  anon_unknown_0 *local_1b8;
  long local_1b0 [15];
  ios_base local_138 [264];
  
  local_1b8 = this + 0x10;
  *(anon_unknown_0 **)this = local_1b8;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (anon_unknown_0)0x0;
  std::__cxx11::istringstream::istringstream((istringstream *)local_1b0,(string *)ctx,_S_in);
  local_1d8 = &local_1c8;
  local_1d0 = 0;
  local_1c8 = 0;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_1b0[0] + -0x18) + (char)(istream *)local_1b0
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,(string *)&local_1d8,cVar2);
    puVar1 = local_1d8;
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      if (*(long *)(this + 8) != 0) {
        std::__cxx11::string::pop_back();
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,CONCAT71(uStack_1c7,local_1c8) + 1);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      return;
    }
    puVar8 = local_1d8 + local_1d0;
    lVar9 = (long)local_1d0 >> 2;
    puVar5 = puVar8;
    if (0 < lVar9) {
      puVar5 = puVar8 + -(local_1d0 & 0xfffffffffffffffc);
      puVar8 = puVar8 + lVar9 * -4;
      lVar9 = lVar9 + 1;
      uVar6 = local_1d0;
      do {
        iVar3 = isspace((int)(char)puVar1[uVar6 - 1]);
        if (iVar3 == 0) {
          puVar7 = puVar1 + uVar6;
          goto LAB_001e8b27;
        }
        iVar3 = isspace((int)(char)puVar1[uVar6 - 2]);
        if (iVar3 == 0) {
          puVar7 = puVar1 + (uVar6 - 1);
          goto LAB_001e8b27;
        }
        iVar3 = isspace((int)(char)puVar1[uVar6 - 3]);
        if (iVar3 == 0) {
          puVar7 = puVar1 + (uVar6 - 2);
          goto LAB_001e8b27;
        }
        iVar3 = isspace((int)(char)puVar1[uVar6 - 4]);
        if (iVar3 == 0) {
          puVar7 = puVar1 + (uVar6 - 3);
          goto LAB_001e8b27;
        }
        uVar6 = uVar6 - 4;
        lVar9 = lVar9 + -1;
      } while (1 < lVar9);
    }
    lVar9 = (long)puVar5 - (long)puVar1;
    if (lVar9 == 1) {
LAB_001e8aea:
      iVar3 = isspace((int)(char)puVar5[-1]);
      puVar7 = puVar5;
      if (iVar3 != 0) {
        puVar7 = puVar1;
      }
    }
    else if (lVar9 == 2) {
LAB_001e8ad2:
      iVar3 = isspace((int)(char)puVar5[-1]);
      puVar7 = puVar5;
      if (iVar3 != 0) {
        puVar5 = puVar8 + -1;
        goto LAB_001e8aea;
      }
    }
    else {
      puVar7 = puVar1;
      if ((lVar9 == 3) && (iVar3 = isspace((int)(char)puVar5[-1]), puVar7 = puVar5, iVar3 != 0)) {
        puVar5 = puVar8 + -1;
        puVar8 = puVar5;
        goto LAB_001e8ad2;
      }
    }
LAB_001e8b27:
    local_1d0 = (long)puVar7 - (long)puVar1;
    *puVar7 = 0;
    lVar9 = std::__cxx11::string::find_first_not_of((char)&local_1d8,0x20);
    if (lVar9 != -1) {
      std::__cxx11::string::_M_append((char *)this,(ulong)local_1d8);
      std::__cxx11::string::push_back((char)this);
    }
  } while( true );
}

Assistant:

std::string cleanup(std::string str)
    {
    std::string res;
    std::istringstream s(str);
    std::string line;
    while (std::getline(s, line))
      {
      line.erase(std::find_if(line.rbegin(), line.rend(), [](int ch)
        {
        return !std::isspace(ch);
        }).base(), line.end());
      auto pos = line.find_first_not_of(' ');
      if (pos != std::string::npos)
        {
        res.append(line);
        res.push_back('\n');
        }
      }
    if (!res.empty())
      res.pop_back(); // remove last newline char
    return res;
    }